

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kws_detections.c
# Opt level: O2

void kws_detections_add(kws_detections_t *detections,char *keyphrase,int sf,int ef,int prob,int ascr
                       )

{
  kws_detections_t kVar1;
  int iVar2;
  undefined8 *puVar3;
  glist_t pgVar4;
  gnode_s **ppgVar5;
  
  ppgVar5 = &detections->detect_list;
  while( true ) {
    kVar1.detect_list = *ppgVar5;
    if (kVar1.detect_list == (glist_t)0x0) {
      puVar3 = (undefined8 *)
               __ckd_calloc__(1,0x18,
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/kws_detections.c"
                              ,0x4a);
      *(int *)(puVar3 + 1) = sf;
      *(int *)((long)puVar3 + 0xc) = ef;
      *puVar3 = keyphrase;
      *(int *)(puVar3 + 2) = prob;
      *(int *)((long)puVar3 + 0x14) = ascr;
      pgVar4 = glist_add_ptr(detections->detect_list,puVar3);
      detections->detect_list = pgVar4;
      return;
    }
    puVar3 = (undefined8 *)((kVar1.detect_list)->data).ptr;
    iVar2 = strcmp(keyphrase,(char *)*puVar3);
    if (((iVar2 == 0) && (*(int *)(puVar3 + 1) < ef)) && (sf < *(int *)((long)puVar3 + 0xc))) break;
    ppgVar5 = &(kVar1.detect_list)->next;
  }
  if (prob <= *(int *)(puVar3 + 2)) {
    return;
  }
  *(int *)(puVar3 + 1) = sf;
  *(int *)((long)puVar3 + 0xc) = ef;
  *(int *)(puVar3 + 2) = prob;
  *(int *)((long)puVar3 + 0x14) = ascr;
  return;
}

Assistant:

void
kws_detections_add(kws_detections_t *detections, const char* keyphrase, int sf, int ef, int prob, int ascr)
{
    gnode_t *gn;
    kws_detection_t* detection;
    for (gn = detections->detect_list; gn; gn = gnode_next(gn)) {
        kws_detection_t *det = (kws_detection_t *)gnode_ptr(gn);
        if (strcmp(keyphrase, det->keyphrase) == 0 && det->sf < ef && det->ef > sf) {
            if (det->prob < prob) {
                det->sf = sf;
                det->ef = ef;
                det->prob = prob;
                det->ascr = ascr;
            }
            return;
        }
    }

    /* Nothing found */
    detection = (kws_detection_t *)ckd_calloc(1, sizeof(*detection));
    detection->sf = sf;
    detection->ef = ef;
    detection->keyphrase = keyphrase;
    detection->prob = prob;
    detection->ascr = ascr;
    detections->detect_list = glist_add_ptr(detections->detect_list, detection);
}